

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall Assimp::ColladaParser::ReadDataArray(ColladaParser *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  mapped_type *pmVar6;
  uint uVar7;
  char *content;
  allocator<char> local_d1;
  ColladaParser *local_d0;
  string s;
  string id;
  string elmName;
  string local_50;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&elmName,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)&s);
  bVar1 = std::operator==(&elmName,"IDREF_array");
  bVar2 = true;
  if (!bVar1) {
    bVar2 = std::operator==(&elmName,"Name_array");
  }
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  uVar4 = GetAttribute(this,"id");
  iVar5 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&id,(char *)CONCAT44(extraout_var_00,iVar5),(allocator<char> *)&s);
  uVar4 = GetAttribute(this,"count");
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar4);
  content = TestTextContent(this);
  s.field_2._M_allocated_capacity = 0;
  s.field_2._8_8_ = 0;
  s._M_dataplus._M_p = (pointer)0x0;
  s._M_string_length = 0;
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
           ::operator[](&this->mDataLibrary,&id);
  Collada::Data::operator=(pmVar6,(Data *)&s);
  Collada::Data::~Data((Data *)&s);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Data>_>_>
           ::operator[](&this->mDataLibrary,&id);
  pmVar6->mIsStringArray = bVar2;
  if (content != (char *)0x0) {
    if (bVar2 == false) {
      std::vector<float,_std::allocator<float>_>::reserve(&pmVar6->mValues,(ulong)uVar4);
      while (bVar1 = uVar4 != 0, uVar4 = uVar4 - 1, bVar1) {
        if (*content == '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&s,"Expected more values while reading float_array contents.",
                     (allocator<char> *)&local_50);
          ThrowException(this,&s);
        }
        content = fast_atoreal_move<float>(content,(float *)&s,true);
        std::vector<float,_std::allocator<float>_>::push_back
                  (&pmVar6->mValues,(value_type_conflict *)&s);
        SkipSpacesAndLineEnd<char>(&content);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(&pmVar6->mStrings,(ulong)uVar4);
      s._M_dataplus._M_p = (pointer)&s.field_2;
      s._M_string_length = 0;
      s.field_2._M_allocated_capacity = s.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_d0 = this;
      for (uVar7 = 0; uVar7 != uVar4; uVar7 = uVar7 + 1) {
        if (*content == '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_50,"Expected more values while reading IDREF_array contents.",
                     &local_d1);
          ThrowException(local_d0,&local_50);
        }
        s._M_string_length = 0;
        *s._M_dataplus._M_p = '\0';
        while( true ) {
          if (((ulong)(byte)*content < 0x21) &&
             ((0x100003601U >> ((ulong)(byte)*content & 0x3f) & 1) != 0)) break;
          content = content + 1;
          std::__cxx11::string::push_back((char)&s);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar6->mStrings,&s);
        SkipSpacesAndLineEnd<char>(&content);
      }
      std::__cxx11::string::~string((string *)&s);
      this = local_d0;
    }
  }
  if ((char)iVar3 == '\0') {
    TestClosing(this,elmName._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&id);
  std::__cxx11::string::~string((string *)&elmName);
  return;
}

Assistant:

void ColladaParser::ReadDataArray()
{
    std::string elmName = mReader->getNodeName();
    bool isStringArray = (elmName == "IDREF_array" || elmName == "Name_array");
    bool isEmptyElement = mReader->isEmptyElement();

    // read attributes
    int indexID = GetAttribute("id");
    std::string id = mReader->getAttributeValue(indexID);
    int indexCount = GetAttribute("count");
    unsigned int count = (unsigned int)mReader->getAttributeValueAsInt(indexCount);
    const char* content = TestTextContent();

    // read values and store inside an array in the data library
    mDataLibrary[id] = Data();
    Data& data = mDataLibrary[id];
    data.mIsStringArray = isStringArray;

    // some exporters write empty data arrays, but we need to conserve them anyways because others might reference them
    if (content)
    {
        if (isStringArray)
        {
            data.mStrings.reserve(count);
            std::string s;

            for (unsigned int a = 0; a < count; a++)
            {
                if (*content == 0)
                    ThrowException("Expected more values while reading IDREF_array contents.");

                s.clear();
                while (!IsSpaceOrNewLine(*content))
                    s += *content++;
                data.mStrings.push_back(s);

                SkipSpacesAndLineEnd(&content);
            }
        }
        else
        {
            data.mValues.reserve(count);

            for (unsigned int a = 0; a < count; a++)
            {
                if (*content == 0)
                    ThrowException("Expected more values while reading float_array contents.");

                ai_real value;
                // read a number
                content = fast_atoreal_move<ai_real>(content, value);
                data.mValues.push_back(value);
                // skip whitespace after it
                SkipSpacesAndLineEnd(&content);
            }
        }
    }

    // test for closing tag
    if (!isEmptyElement)
        TestClosing(elmName.c_str());
}